

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
PrecomputedTransactionData::Init<CMutableTransaction>
          (PrecomputedTransactionData *this,CMutableTransaction *txTo,
          vector<CTxOut,_std::allocator<CTxOut>_> *spent_outputs,bool force)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  CMutableTransaction *pCVar4;
  size_type sVar5;
  uchar *puVar6;
  byte in_CL;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_t inpos;
  bool uses_bip341_taproot;
  bool uses_bip143_segwit;
  undefined7 in_stack_fffffffffffffea8;
  byte in_stack_fffffffffffffeaf;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffeb0;
  ulong __n;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  byte bVar7;
  CMutableTransaction *in_stack_fffffffffffffec0;
  ulong local_130;
  byte local_123;
  byte local_122;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_123 = in_CL & 1;
  if (((*(byte *)(in_RDI + 0x24) ^ 0xff) & 1) == 0) {
    __assert_fail("!m_spent_outputs_ready",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x578,
                  "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CMutableTransaction]"
                 );
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
            );
  bVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::empty
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  if (!bVar2) {
    in_stack_fffffffffffffec0 =
         (CMutableTransaction *)
         std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                   ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                    CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    pCVar4 = (CMutableTransaction *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    if (in_stack_fffffffffffffec0 != pCVar4) {
      __assert_fail("m_spent_outputs.size() == txTo.vin.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                    ,0x57c,
                    "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CMutableTransaction]"
                   );
    }
    *(undefined1 *)(in_RDI + 0x24) = 1;
  }
  local_130 = 0;
  local_122 = local_123;
  while( true ) {
    __n = local_130;
    sVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    bVar7 = 0;
    if (__n < sVar5) {
      in_stack_fffffffffffffeaf = 0;
      if (local_122 != 0) {
        in_stack_fffffffffffffeaf = local_123;
      }
      bVar7 = in_stack_fffffffffffffeaf ^ 0xff;
    }
    if ((bVar7 & 1) == 0) break;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)CONCAT17(bVar7,in_stack_fffffffffffffeb8),
               __n);
    bVar2 = CScriptWitness::IsNull
                      ((CScriptWitness *)
                       CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    if (!bVar2) {
      if ((*(byte *)(in_RDI + 0x24) & 1) != 0) {
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   CONCAT17(bVar7,in_stack_fffffffffffffeb8),__n);
        sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           CONCAT17(bVar7,in_stack_fffffffffffffeb8));
        if (sVar3 == 0x22) {
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(bVar7,in_stack_fffffffffffffeb8),__n);
          puVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                             ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                              CONCAT17(bVar7,in_stack_fffffffffffffeb8),(size_type)(__n >> 0x20));
          if (*puVar6 == 'Q') {
            local_123 = 1;
            goto LAB_01025722;
          }
        }
      }
      local_122 = 1;
    }
LAB_01025722:
    if ((local_123 != 0) && (local_122 != 0)) break;
    local_130 = local_130 + 1;
  }
  if ((local_122 != 0) || (local_123 != 0)) {
    anon_unknown.dwarf_1e9f79c::GetPrevoutsSHA256<CMutableTransaction>(in_stack_fffffffffffffec0);
    *in_RDI = local_28;
    in_RDI[1] = local_20;
    in_RDI[2] = local_18;
    in_RDI[3] = local_10;
    anon_unknown.dwarf_1e9f79c::GetSequencesSHA256<CMutableTransaction>(in_stack_fffffffffffffec0);
    in_RDI[4] = local_48;
    in_RDI[5] = local_40;
    in_RDI[6] = local_38;
    in_RDI[7] = local_30;
    anon_unknown.dwarf_1e9f79c::GetOutputsSHA256<CMutableTransaction>(in_stack_fffffffffffffec0);
    in_RDI[8] = local_68;
    in_RDI[9] = local_60;
    in_RDI[10] = local_58;
    in_RDI[0xb] = local_50;
  }
  if (local_122 != 0) {
    SHA256Uint256((uint256 *)in_stack_fffffffffffffec0);
    *(undefined8 *)((long)in_RDI + 0xa1) = local_88;
    *(undefined8 *)((long)in_RDI + 0xa9) = local_80;
    *(undefined8 *)((long)in_RDI + 0xb1) = local_78;
    *(undefined8 *)((long)in_RDI + 0xb9) = local_70;
    SHA256Uint256((uint256 *)in_stack_fffffffffffffec0);
    *(undefined8 *)((long)in_RDI + 0xc1) = local_a8;
    *(undefined8 *)((long)in_RDI + 0xc9) = local_a0;
    *(undefined8 *)((long)in_RDI + 0xd1) = local_98;
    *(undefined8 *)((long)in_RDI + 0xd9) = local_90;
    SHA256Uint256((uint256 *)in_stack_fffffffffffffec0);
    *(undefined8 *)((long)in_RDI + 0xe1) = local_c8;
    *(undefined8 *)((long)in_RDI + 0xe9) = local_c0;
    *(undefined8 *)((long)in_RDI + 0xf1) = local_b8;
    *(undefined8 *)((long)in_RDI + 0xf9) = local_b0;
    *(undefined1 *)((long)in_RDI + 0x101) = 1;
  }
  if ((local_123 != 0) && ((*(byte *)(in_RDI + 0x24) & 1) != 0)) {
    anon_unknown.dwarf_1e9f79c::GetSpentAmountsSHA256
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffec0);
    in_RDI[0xc] = local_e8;
    in_RDI[0xd] = local_e0;
    in_RDI[0xe] = local_d8;
    in_RDI[0xf] = local_d0;
    anon_unknown.dwarf_1e9f79c::GetSpentScriptsSHA256
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffec0);
    in_RDI[0x10] = local_108;
    in_RDI[0x11] = local_100;
    in_RDI[0x12] = local_f8;
    in_RDI[0x13] = local_f0;
    *(undefined1 *)(in_RDI + 0x14) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PrecomputedTransactionData::Init(const T& txTo, std::vector<CTxOut>&& spent_outputs, bool force)
{
    assert(!m_spent_outputs_ready);

    m_spent_outputs = std::move(spent_outputs);
    if (!m_spent_outputs.empty()) {
        assert(m_spent_outputs.size() == txTo.vin.size());
        m_spent_outputs_ready = true;
    }

    // Determine which precomputation-impacting features this transaction uses.
    bool uses_bip143_segwit = force;
    bool uses_bip341_taproot = force;
    for (size_t inpos = 0; inpos < txTo.vin.size() && !(uses_bip143_segwit && uses_bip341_taproot); ++inpos) {
        if (!txTo.vin[inpos].scriptWitness.IsNull()) {
            if (m_spent_outputs_ready && m_spent_outputs[inpos].scriptPubKey.size() == 2 + WITNESS_V1_TAPROOT_SIZE &&
                m_spent_outputs[inpos].scriptPubKey[0] == OP_1) {
                // Treat every witness-bearing spend with 34-byte scriptPubKey that starts with OP_1 as a Taproot
                // spend. This only works if spent_outputs was provided as well, but if it wasn't, actual validation
                // will fail anyway. Note that this branch may trigger for scriptPubKeys that aren't actually segwit
                // but in that case validation will fail as SCRIPT_ERR_WITNESS_UNEXPECTED anyway.
                uses_bip341_taproot = true;
            } else {
                // Treat every spend that's not known to native witness v1 as a Witness v0 spend. This branch may
                // also be taken for unknown witness versions, but it is harmless, and being precise would require
                // P2SH evaluation to find the redeemScript.
                uses_bip143_segwit = true;
            }
        }
        if (uses_bip341_taproot && uses_bip143_segwit) break; // No need to scan further if we already need all.
    }

    if (uses_bip143_segwit || uses_bip341_taproot) {
        // Computations shared between both sighash schemes.
        m_prevouts_single_hash = GetPrevoutsSHA256(txTo);
        m_sequences_single_hash = GetSequencesSHA256(txTo);
        m_outputs_single_hash = GetOutputsSHA256(txTo);
    }
    if (uses_bip143_segwit) {
        hashPrevouts = SHA256Uint256(m_prevouts_single_hash);
        hashSequence = SHA256Uint256(m_sequences_single_hash);
        hashOutputs = SHA256Uint256(m_outputs_single_hash);
        m_bip143_segwit_ready = true;
    }
    if (uses_bip341_taproot && m_spent_outputs_ready) {
        m_spent_amounts_single_hash = GetSpentAmountsSHA256(m_spent_outputs);
        m_spent_scripts_single_hash = GetSpentScriptsSHA256(m_spent_outputs);
        m_bip341_taproot_ready = true;
    }
}